

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

Vector<double,_std::allocator<double>_> * __thiscall
amrex::MLNodeLinOp::getSolvabilityOffset(MLNodeLinOp *this,int amrlev,int mglev,Any *a_rhs)

{
  initializer_list<std::reference_wrapper<double>_> iVar1;
  initializer_list<double> iVar2;
  int *piVar3;
  type_conflict1 *ptVar4;
  int in_ECX;
  long in_RSI;
  Vector<double,_std::allocator<double>_> *in_RDI;
  Real s2;
  Real s1;
  Type r;
  MultiArray4<const_double> *rhs_ma;
  MultiArray4<const_double> *mask_ma;
  MultiFab *mask;
  MultiFab *rhs;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffea8;
  MPI_Comm comm;
  allocator_type *paVar5;
  Vector<int,_std::allocator<int>_> *in_stack_fffffffffffffeb0;
  MultiFab *this_00;
  IntVect *this_01;
  gpu_tuple_impl<0UL,_double,_double> *pgVar6;
  long local_128;
  allocator_type local_101;
  double local_100;
  double *local_f8;
  undefined8 local_f0;
  undefined1 local_d0 [16];
  undefined1 *local_c0;
  undefined8 local_b8;
  type_conflict1 local_98;
  type_conflict1 local_90;
  Array4<const_double> *local_88;
  Array4<const_double> *local_80;
  IntVect local_78;
  gpu_tuple_impl<0UL,_double,_double> local_68;
  Array4<const_double> *local_58;
  Array4<const_double> **local_50;
  Array4<const_double> *local_48;
  Array4<const_double> **local_40;
  long local_38;
  MultiFab *local_30;
  int local_20;
  undefined1 local_1c [20];
  undefined1 *local_8;
  
  local_8 = local_1c;
  local_20 = in_ECX;
  local_30 = Any::get<amrex::MultiFab>((Any *)in_RDI);
  piVar3 = Vector<int,_std::allocator<int>_>::operator[]
                     (in_stack_fffffffffffffeb0,(size_type)in_stack_fffffffffffffea8);
  if (local_20 + 1 == *piVar3) {
    local_128 = in_RSI + 0x248;
  }
  else {
    local_128 = in_RSI + 0x3c8;
  }
  local_38 = local_128;
  local_48 = (Array4<const_double> *)
             FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                       (in_stack_fffffffffffffea8);
  local_40 = &local_48;
  local_58 = (Array4<const_double> *)
             FabArray<amrex::FArrayBox>::const_arrays<amrex::FArrayBox,_0>
                       (in_stack_fffffffffffffea8);
  local_50 = &local_58;
  this_01 = &local_78;
  this_00 = local_30;
  IntVect::IntVect(this_01,0);
  local_88 = *local_40;
  local_80 = *local_50;
  local_68 = (gpu_tuple_impl<0UL,_double,_double>)
             ParReduce<amrex::ReduceOpSum,amrex::ReduceOpSum,double,double,amrex::FArrayBox,amrex::MLNodeLinOp::getSolvabilityOffset(int,int,amrex::Any_const&)const::__0,void>
                       (this_00,this_01,&local_88);
  pgVar6 = &local_68;
  ptVar4 = get<0ul,double,double>((GpuTuple<double,_double> *)0x1682d82);
  local_90 = *ptVar4;
  ptVar4 = get<1ul,double,double>((GpuTuple<double,_double> *)0x1682d99);
  local_98 = *ptVar4;
  std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
            ((reference_wrapper<double> *)this_00,(double *)in_stack_fffffffffffffea8);
  std::reference_wrapper<double>::reference_wrapper<double&,void,double*>
            ((reference_wrapper<double> *)this_00,(double *)in_stack_fffffffffffffea8);
  local_b8 = 2;
  local_c0 = local_d0;
  std::allocator<std::reference_wrapper<double>_>::allocator
            ((allocator<std::reference_wrapper<double>_> *)0x1682e00);
  iVar1._M_len = (size_type)pgVar6;
  iVar1._M_array = (iterator)this_01;
  Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::vector
            ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
              *)this_00,iVar1,(allocator_type *)in_stack_fffffffffffffea8);
  comm = (MPI_Comm)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  ParallelContext::CommunicatorSub();
  ParallelAllReduce::Sum<double>
            ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
              *)this_00,comm);
  Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>::~Vector
            ((Vector<std::reference_wrapper<double>,_std::allocator<std::reference_wrapper<double>_>_>
              *)0x1682e47);
  std::allocator<std::reference_wrapper<double>_>::~allocator
            ((allocator<std::reference_wrapper<double>_> *)0x1682e54);
  local_100 = local_90 / local_98;
  local_f8 = &local_100;
  local_f0 = 1;
  paVar5 = &local_101;
  std::allocator<double>::allocator((allocator<double> *)0x1682e91);
  iVar2._M_len = (size_type)pgVar6;
  iVar2._M_array = (iterator)this_01;
  Vector<double,_std::allocator<double>_>::vector
            ((Vector<double,_std::allocator<double>_> *)this_00,iVar2,paVar5);
  std::allocator<double>::~allocator((allocator<double> *)0x1682eb5);
  return in_RDI;
}

Assistant:

Vector<Real>
MLNodeLinOp::getSolvabilityOffset (int amrlev, int mglev, Any const& a_rhs) const
{
    amrex::ignore_unused(amrlev);
    AMREX_ASSERT(amrlev==0 && (mglev+1==m_num_mg_levels[0] || mglev==0));
    AMREX_ASSERT(getNComp() == 1);

    AMREX_ASSERT(a_rhs.is<MultiFab>());
    auto const& rhs = a_rhs.get<MultiFab>();

    const auto& mask = (mglev+1 == m_num_mg_levels[0]) ? m_bottom_dot_mask : m_coarse_dot_mask;
    const auto& mask_ma = mask.const_arrays();
    const auto& rhs_ma = rhs.const_arrays();
    auto r = ParReduce(TypeList<ReduceOpSum,ReduceOpSum>{}, TypeList<Real,Real>{},
                       rhs, IntVect(0),
                       [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                           -> GpuTuple<Real,Real>
                       {
                           return { mask_ma[box_no](i,j,k) * rhs_ma[box_no](i,j,k),
                                    mask_ma[box_no](i,j,k) };
                       });

    Real s1 = amrex::get<0>(r);
    Real s2 = amrex::get<1>(r);
    ParallelAllReduce::Sum<Real>({s1,s2}, ParallelContext::CommunicatorSub());
    return {s1/s2};
}